

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KdTree.cc
# Opt level: O0

void __thiscall hrvo::KdTree::queryRecursive(KdTree *this,Agent *agent,float *rangeSq,size_t node)

{
  const_reference pNVar1;
  size_t sVar2;
  float *pfVar3;
  vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *pvVar4;
  float *in_RCX;
  Agent *in_RDX;
  KdTree *in_RSI;
  long in_RDI;
  float fVar5;
  float distSqRight;
  float distRightMaxY;
  float distRightMinY;
  float distRightMaxX;
  float distRightMinX;
  float distSqLeft;
  float distLeftMaxY;
  float distLeftMinY;
  float distLeftMaxX;
  float distLeftMinX;
  size_t i;
  float *in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  Agent *in_stack_ffffffffffffff40;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float local_6c;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  float local_58;
  float local_54;
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  float local_30;
  float local_2c;
  size_t in_stack_ffffffffffffffd8;
  ulong __n;
  
  pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                     ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                      (in_RDI + 0x20),(size_type)in_RCX);
  sVar2 = pNVar1->end_;
  pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                     ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                      (in_RDI + 0x20),(size_type)in_RCX);
  if (sVar2 - pNVar1->begin_ < 0xb) {
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),(size_type)in_RCX);
    sVar2 = pNVar1->begin_;
    while (__n = sVar2,
          pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                             ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                              (in_RDI + 0x20),(size_type)in_RCX), sVar2 < pNVar1->end_) {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 8),__n);
      Agent::insertNeighbor
                (in_stack_ffffffffffffff40,
                 CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                 in_stack_ffffffffffffff30);
      sVar2 = __n + 1;
    }
  }
  else {
    local_30 = 0.0;
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),(size_type)in_RCX);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),pNVar1->left_);
    fVar5 = pNVar1->minX_;
    local_34 = Vector2::getX((Vector2 *)
                             &(in_RSI->agents_).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
    local_34 = fVar5 - local_34;
    pfVar3 = std::max<float>(&local_30,&local_34);
    local_2c = *pfVar3;
    local_3c = 0.0;
    fVar5 = Vector2::getX((Vector2 *)
                          &(in_RSI->agents_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),(size_type)in_RCX);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),pNVar1->left_);
    local_40 = fVar5 - pNVar1->maxX_;
    pfVar3 = std::max<float>(&local_3c,&local_40);
    local_38 = *pfVar3;
    local_48 = 0.0;
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),(size_type)in_RCX);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),pNVar1->left_);
    fVar5 = pNVar1->minY_;
    local_4c = Vector2::getY((Vector2 *)
                             &(in_RSI->agents_).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
    local_4c = fVar5 - local_4c;
    pfVar3 = std::max<float>(&local_48,&local_4c);
    local_44 = *pfVar3;
    local_54 = 0.0;
    fVar5 = Vector2::getY((Vector2 *)
                          &(in_RSI->agents_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),(size_type)in_RCX);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),pNVar1->left_);
    local_58 = fVar5 - pNVar1->maxY_;
    pfVar3 = std::max<float>(&local_54,&local_58);
    local_50 = *pfVar3;
    local_5c = local_50 * local_50 + local_44 * local_44 + local_2c * local_2c + local_38 * local_38
    ;
    local_64 = 0.0;
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),(size_type)in_RCX);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),pNVar1->right_);
    fVar5 = pNVar1->minX_;
    local_68 = Vector2::getX((Vector2 *)
                             &(in_RSI->agents_).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
    local_68 = fVar5 - local_68;
    pfVar3 = std::max<float>(&local_64,&local_68);
    local_60 = *pfVar3;
    local_70 = 0.0;
    fVar5 = Vector2::getX((Vector2 *)
                          &(in_RSI->agents_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),(size_type)in_RCX);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),pNVar1->right_);
    local_74 = fVar5 - pNVar1->maxX_;
    pfVar3 = std::max<float>(&local_70,&local_74);
    local_6c = *pfVar3;
    local_7c = 0.0;
    pvVar4 = (vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)(in_RDI + 0x20);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),(size_type)in_RCX);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       (pvVar4,pNVar1->right_);
    fVar5 = pNVar1->minY_;
    local_80 = Vector2::getY((Vector2 *)
                             &(in_RSI->agents_).
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
    local_80 = fVar5 - local_80;
    pfVar3 = std::max<float>(&local_7c,&local_80);
    local_78 = *pfVar3;
    local_88 = 0.0;
    fVar5 = Vector2::getY((Vector2 *)
                          &(in_RSI->agents_).
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish);
    pvVar4 = (vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)(in_RDI + 0x20);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                        (in_RDI + 0x20),(size_type)in_RCX);
    pNVar1 = std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                       (pvVar4,pNVar1->right_);
    local_8c = fVar5 - pNVar1->maxY_;
    pfVar3 = std::max<float>(&local_88,&local_8c);
    local_84 = *pfVar3;
    fVar5 = local_84 * local_84 + local_78 * local_78 + local_60 * local_60 + local_6c * local_6c;
    if (fVar5 <= local_5c) {
      if (fVar5 < *(float *)&in_RDX->simulator_) {
        std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                  ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                   (in_RDI + 0x20),(size_type)in_RCX);
        queryRecursive(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
        if (local_5c < *(float *)&in_RDX->simulator_) {
          std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                    ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                     (in_RDI + 0x20),(size_type)in_RCX);
          queryRecursive(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
        }
      }
    }
    else if (local_5c < *(float *)&in_RDX->simulator_) {
      std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)(in_RDI + 0x20),
                 (size_type)in_RCX);
      queryRecursive(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      if (fVar5 < *(float *)&in_RDX->simulator_) {
        std::vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_>::operator[]
                  ((vector<hrvo::KdTree::Node,_std::allocator<hrvo::KdTree::Node>_> *)
                   (in_RDI + 0x20),(size_type)in_RCX);
        queryRecursive(in_RSI,in_RDX,in_RCX,in_stack_ffffffffffffffd8);
      }
    }
  }
  return;
}

Assistant:

void KdTree::queryRecursive(Agent *agent, float &rangeSq,
                            std::size_t node) const {
  if (nodes_[node].end_ - nodes_[node].begin_ <= HRVO_MAX_LEAF_SIZE) {
    for (std::size_t i = nodes_[node].begin_; i < nodes_[node].end_; ++i) {
      agent->insertNeighbor(agents_[i], rangeSq);
    }
  } else {
    const float distLeftMinX = std::max(
        0.0F, nodes_[nodes_[node].left_].minX_ - agent->position_.getX());
    const float distLeftMaxX = std::max(
        0.0F, agent->position_.getX() - nodes_[nodes_[node].left_].maxX_);
    const float distLeftMinY = std::max(
        0.0F, nodes_[nodes_[node].left_].minY_ - agent->position_.getY());
    const float distLeftMaxY = std::max(
        0.0F, agent->position_.getY() - nodes_[nodes_[node].left_].maxY_);

    const float distSqLeft =
        distLeftMinX * distLeftMinX + distLeftMaxX * distLeftMaxX +
        distLeftMinY * distLeftMinY + distLeftMaxY * distLeftMaxY;

    const float distRightMinX = std::max(
        0.0F, nodes_[nodes_[node].right_].minX_ - agent->position_.getX());
    const float distRightMaxX = std::max(
        0.0F, agent->position_.getX() - nodes_[nodes_[node].right_].maxX_);
    const float distRightMinY = std::max(
        0.0F, nodes_[nodes_[node].right_].minY_ - agent->position_.getY());
    const float distRightMaxY = std::max(
        0.0F, agent->position_.getY() - nodes_[nodes_[node].right_].maxY_);

    const float distSqRight =
        distRightMinX * distRightMinX + distRightMaxX * distRightMaxX +
        distRightMinY * distRightMinY + distRightMaxY * distRightMaxY;

    if (distSqLeft < distSqRight) {
      if (distSqLeft < rangeSq) {
        queryRecursive(agent, rangeSq, nodes_[node].left_);

        if (distSqRight < rangeSq) {
          queryRecursive(agent, rangeSq, nodes_[node].right_);
        }
      }
    } else {
      if (distSqRight < rangeSq) {
        queryRecursive(agent, rangeSq, nodes_[node].right_);

        if (distSqLeft < rangeSq) {
          queryRecursive(agent, rangeSq, nodes_[node].left_);
        }
      }
    }
  }
}